

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NeuralNetwork.pb.cc
# Opt level: O0

void __thiscall CoreML::Specification::PaddingLayerParams::SharedDtor(PaddingLayerParams *this)

{
  BorderAmounts *this_00;
  bool bVar1;
  Arena *pAVar2;
  LogMessage *other;
  PaddingLayerParams *pPVar3;
  LogFinisher local_5d [20];
  byte local_49;
  LogMessage local_48;
  PaddingLayerParams *local_10;
  PaddingLayerParams *this_local;
  
  local_10 = this;
  pAVar2 = google::protobuf::MessageLite::GetArenaForAllocation(&this->super_MessageLite);
  local_49 = 0;
  if (pAVar2 != (Arena *)0x0) {
    google::protobuf::internal::LogMessage::LogMessage
              (&local_48,LOGLEVEL_DFATAL,
               "/workspace/llm4binary/github/license_c_cmakelists/apple[P]coremltools/build_O0/mlmodel/format/NeuralNetwork.pb.cc"
               ,0x6d89);
    local_49 = 1;
    other = google::protobuf::internal::LogMessage::operator<<
                      (&local_48,"CHECK failed: GetArenaForAllocation() == nullptr: ");
    google::protobuf::internal::LogFinisher::operator=(local_5d,other);
  }
  if ((local_49 & 1) != 0) {
    google::protobuf::internal::LogMessage::~LogMessage(&local_48);
  }
  pPVar3 = internal_default_instance();
  if ((this != pPVar3) && (this_00 = this->paddingamounts_, this_00 != (BorderAmounts *)0x0)) {
    BorderAmounts::~BorderAmounts(this_00);
    operator_delete(this_00,0x30);
  }
  bVar1 = has_PaddingType(this);
  if (bVar1) {
    clear_PaddingType(this);
  }
  return;
}

Assistant:

inline void PaddingLayerParams::SharedDtor() {
  GOOGLE_DCHECK(GetArenaForAllocation() == nullptr);
  if (this != internal_default_instance()) delete paddingamounts_;
  if (has_PaddingType()) {
    clear_PaddingType();
  }
}